

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 NavCalcPreferredRefPos(void)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  float fVar5;
  float fVar6;
  float rhs;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImRect visible_rect;
  ImVec2 local_28;
  ImVec2 pos;
  ImRect *rect_rel;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  if ((((GImGui->NavDisableHighlight & 1U) == 0) && ((GImGui->NavDisableMouseHover & 1U) != 0)) &&
     (GImGui->NavWindow != (ImGuiWindow *)0x0)) {
    pos = (ImVec2)(GImGui->NavWindow->NavRectRel + GImGui->NavLayer);
    pIVar3 = GImGui->NavWindow;
    fVar1 = *(float *)pos;
    fVar2 = (GImGui->Style).FramePadding.x;
    fVar5 = ImRect::GetWidth((ImRect *)pos);
    fVar6 = ImMin<float>(fVar2 * 4.0,fVar5);
    fVar2 = *(float *)((long)pos + 0xc);
    fVar5 = (pIVar4->Style).FramePadding.y;
    rhs = ImRect::GetHeight((ImRect *)pos);
    fVar5 = ImMin<float>(fVar5,rhs);
    ImVec2::ImVec2(&visible_rect.Max,fVar1 + fVar6,fVar2 - fVar5);
    local_28 = operator+(&pIVar3->Pos,&visible_rect.Max);
    _local_40 = GetViewportRect();
    local_48 = ImClamp(&local_28,(ImVec2 *)local_40,visible_rect.Min);
    g = (ImGuiContext *)ImFloor(&local_48);
  }
  else {
    g = (ImGuiContext *)ImFloor(&(GImGui->IO).MousePos);
  }
  return (ImVec2)g;
}

Assistant:

static ImVec2 NavCalcPreferredRefPos()
{
    ImGuiContext& g = *GImGui;
    if (g.NavDisableHighlight || !g.NavDisableMouseHover || !g.NavWindow)
        return ImFloor(g.IO.MousePos);

    // When navigation is active and mouse is disabled, decide on an arbitrary position around the bottom left of the currently navigated item
    const ImRect& rect_rel = g.NavWindow->NavRectRel[g.NavLayer];
    ImVec2 pos = g.NavWindow->Pos + ImVec2(rect_rel.Min.x + ImMin(g.Style.FramePadding.x*4, rect_rel.GetWidth()), rect_rel.Max.y - ImMin(g.Style.FramePadding.y, rect_rel.GetHeight()));
    ImRect visible_rect = GetViewportRect();
    return ImFloor(ImClamp(pos, visible_rect.Min, visible_rect.Max));   // ImFloor() is important because non-integer mouse position application in back-end might be lossy and result in undesirable non-zero delta.
}